

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpg.c
# Opt level: O0

void load_jpg_entry_helper(ALLEGRO_FILE *fp,load_jpg_entry_helper_data *data,int flags)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  ulong uVar5;
  undefined1 *puVar6;
  byte *in_RSI;
  int y_1;
  int x;
  uchar *out_1;
  uchar *in;
  uchar *out [1];
  int y;
  int s;
  int h;
  int w;
  ALLEGRO_LOCKED_REGION *lock;
  my_err_mgr jerr;
  jpeg_decompress_struct cinfo;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  ALLEGRO_FILE *in_stack_fffffffffffffbb8;
  j_decompress_ptr in_stack_fffffffffffffbc0;
  long local_438;
  int local_42c;
  int local_428;
  int local_424;
  long *local_420;
  code *local_418 [21];
  __jmp_buf_tag _Stack_370;
  undefined8 local_2a8 [17];
  int local_220;
  int local_21c;
  int local_214;
  int local_200;
  byte *local_10;
  
  *in_RSI = 0;
  local_10 = in_RSI;
  local_2a8[0] = jpeg_std_error(local_418);
  local_418[0] = my_error_exit;
  iVar1 = _setjmp(&_Stack_370);
  if (iVar1 == 0) {
    uVar2 = al_malloc_with_context
                      (0x1000,0xb8,
                       "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                       ,"load_jpg_entry_helper");
    *(undefined8 *)(local_10 + 0x10) = uVar2;
    if (*(long *)(local_10 + 0x10) == 0) {
      *local_10 = 1;
    }
    else {
      jpeg_CreateDecompress(local_2a8,0x50,0x290);
      jpeg_packfile_src(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                        (JOCTET *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      jpeg_read_header(local_2a8,1);
      jpeg_start_decompress(local_2a8);
      local_424 = local_220;
      local_428 = local_21c;
      local_42c = local_214;
      if ((local_214 == 1) || (local_214 == 3)) {
        uVar2 = al_create_bitmap(local_220,local_21c);
        *(undefined8 *)(local_10 + 8) = uVar2;
        if (*(long *)(local_10 + 8) == 0) {
          *local_10 = 1;
          uVar5 = _al_trace_prefix(__al_debug_channel,3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                                   ,0xd1,"load_jpg_entry_helper");
          if ((uVar5 & 1) != 0) {
            _al_trace_suffix("%dx%d bitmap creation failed\n",local_424,local_428);
          }
        }
        else {
          local_420 = (long *)al_lock_bitmap(*(undefined8 *)(local_10 + 8),0x13,2);
          if (local_42c == 3) {
            while (local_200 < local_428) {
              local_438 = *local_420 + (long)(local_200 * *(int *)((long)local_420 + 0xc));
              jpeg_read_scanlines(local_2a8,&local_438,1);
            }
          }
          else if (local_42c == 1) {
            uVar2 = al_malloc_with_context
                              ((long)local_424,0xf6,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                               ,"load_jpg_entry_helper");
            *(undefined8 *)(local_10 + 0x18) = uVar2;
            while (local_200 < local_428) {
              iVar1 = local_200;
              jpeg_read_scanlines(local_2a8,local_10 + 0x18,1);
              puVar4 = *(undefined1 **)(local_10 + 0x18);
              puVar3 = (undefined1 *)(*local_420 + (long)(iVar1 * *(int *)((long)local_420 + 0xc)));
              for (iVar1 = 0; iVar1 < local_424; iVar1 = iVar1 + 1) {
                *puVar3 = *puVar4;
                puVar6 = puVar3 + 2;
                puVar3[1] = *puVar4;
                puVar3 = puVar3 + 3;
                *puVar6 = *puVar4;
                puVar4 = puVar4 + 1;
              }
            }
          }
        }
      }
      else {
        *local_10 = 1;
        uVar5 = _al_trace_prefix(__al_debug_channel,3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                                 ,0xca,"load_jpg_entry_helper");
        if ((uVar5 & 1) != 0) {
          _al_trace_suffix("%d components makes no sense\n",local_42c);
        }
      }
    }
    jpeg_finish_decompress(local_2a8);
  }
  else {
    *local_10 = 1;
  }
  jpeg_destroy_decompress(local_2a8);
  if (*(long *)(local_10 + 8) != 0) {
    uVar5 = al_is_bitmap_locked(*(undefined8 *)(local_10 + 8));
    if ((uVar5 & 1) != 0) {
      al_unlock_bitmap(*(undefined8 *)(local_10 + 8));
    }
    if ((*local_10 & 1) != 0) {
      al_destroy_bitmap(*(undefined8 *)(local_10 + 8));
      local_10[8] = 0;
      local_10[9] = 0;
      local_10[10] = 0;
      local_10[0xb] = 0;
      local_10[0xc] = 0;
      local_10[0xd] = 0;
      local_10[0xe] = 0;
      local_10[0xf] = 0;
    }
  }
  al_free_with_context
            (*(undefined8 *)(local_10 + 0x10),0x114,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
             ,"load_jpg_entry_helper");
  al_free_with_context
            (*(undefined8 *)(local_10 + 0x18),0x115,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
             ,"load_jpg_entry_helper");
  return;
}

Assistant:

static void load_jpg_entry_helper(ALLEGRO_FILE *fp,
   struct load_jpg_entry_helper_data *data, int flags)
{
   struct jpeg_decompress_struct cinfo;
   struct my_err_mgr jerr;
   ALLEGRO_LOCKED_REGION *lock;
   int w, h, s;

   /* ALLEGRO_NO_PREMULTIPLIED_ALPHA does not apply.
    * ALLEGRO_KEEP_INDEX does not apply.
    */
   (void)flags;

   data->error = false;

   cinfo.err = jpeg_std_error(&jerr.pub);
   jerr.pub.error_exit = my_error_exit;
   if (setjmp(jerr.jmpenv) != 0) {
      /* Longjmp'd. */
      data->error = true;
      goto longjmp_error;
   }

   data->buffer = al_malloc(BUFFER_SIZE);
   if (!data->buffer) {
      data->error = true;
      goto error;
   }

   jpeg_create_decompress(&cinfo);
   jpeg_packfile_src(&cinfo, fp, data->buffer);
   jpeg_read_header(&cinfo, true);
   jpeg_start_decompress(&cinfo);

   w = cinfo.output_width;
   h = cinfo.output_height;
   s = cinfo.output_components;

   /* Only one and three components make sense in a JPG file. */
   if (s != 1 && s != 3) {
      data->error = true;
      ALLEGRO_ERROR("%d components makes no sense\n", s);
      goto error;
   }

   data->bmp = al_create_bitmap(w, h);
   if (!data->bmp) {
      data->error = true;
      ALLEGRO_ERROR("%dx%d bitmap creation failed\n", w, h);
      goto error;
   }

   /* Allegro's pixel format is endian independent, so that in
    * ALLEGRO_PIXEL_FORMAT_RGB_888 the lower 8 bits always hold the Blue
    * component.  On a little endian system this is in byte 0.  On a big
    * endian system this is in byte 2.
    *
    * libjpeg expects byte 0 to hold the Red component, byte 1 to hold the
    * Green component, byte 2 to hold the Blue component.  Hence on little
    * endian systems we need the opposite format, ALLEGRO_PIXEL_FORMAT_BGR_888.
    */
#ifdef ALLEGRO_BIG_ENDIAN
   lock = al_lock_bitmap(data->bmp, ALLEGRO_PIXEL_FORMAT_RGB_888,
       ALLEGRO_LOCK_WRITEONLY);
#else
   lock = al_lock_bitmap(data->bmp, ALLEGRO_PIXEL_FORMAT_BGR_888,
       ALLEGRO_LOCK_WRITEONLY);
#endif

   if (s == 3) {
      /* Colour. */
      int y;

      for (y = cinfo.output_scanline; y < h; y = cinfo.output_scanline) {
         unsigned char *out[1];
         out[0] = ((unsigned char *)lock->data) + y * lock->pitch;
         jpeg_read_scanlines(&cinfo, (void *)out, 1);
      }
   }
   else if (s == 1) {
      /* Greyscale. */
      unsigned char *in;
      unsigned char *out;
      int x, y;

      data->row = al_malloc(w);
      for (y = cinfo.output_scanline; y < h; y = cinfo.output_scanline) {
         jpeg_read_scanlines(&cinfo, (void *)&data->row, 1);
         in = data->row;
         out = ((unsigned char *)lock->data) + y * lock->pitch;
         for (x = 0; x < w; x++) {
            *out++ = *in;
            *out++ = *in;
            *out++ = *in;
            in++;
         }
      }
   }

 error:
   jpeg_finish_decompress(&cinfo);

 longjmp_error:
   jpeg_destroy_decompress(&cinfo);

   if (data->bmp) {
      if (al_is_bitmap_locked(data->bmp)) {
         al_unlock_bitmap(data->bmp);
      }
      if (data->error) {
         al_destroy_bitmap(data->bmp);
         data->bmp = NULL;
      }
   }

   al_free(data->buffer);
   al_free(data->row);
}